

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O1

FEvent * __thiscall FEventTree::Predecessor(FEventTree *this,FEvent *event)

{
  FEventTree *pFVar1;
  FEventTree *pFVar2;
  bool bVar3;
  
  pFVar1 = (FEventTree *)event->Left;
  if ((FEventTree *)event->Left == this) {
    do {
      pFVar2 = (FEventTree *)(((FEventTree *)event)->Nil).Parent;
      if (pFVar2 == this) {
        return &pFVar2->Nil;
      }
      bVar3 = (FEventTree *)event == (FEventTree *)(pFVar2->Nil).Left;
      event = (FEvent *)pFVar2;
    } while (bVar3);
  }
  else {
    do {
      pFVar2 = pFVar1;
      pFVar1 = (FEventTree *)(pFVar2->Nil).Right;
    } while (pFVar1 != this);
  }
  return &pFVar2->Nil;
}

Assistant:

FEvent *FEventTree::Predecessor (FEvent *event) const
{
	if (event->Left != &Nil)
	{
		event = event->Left;
		while (event->Right != &Nil)
		{
			event = event->Right;
		}
		return event;
	}
	else
	{
		FEvent *y = event->Parent;
		while (y != &Nil && event == y->Left)
		{
			event = y;
			y = y->Parent;
		}
		return y;
	}
}